

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wnorm
                   (char_t *s,char_t end_quote)

{
  byte *pbVar1;
  gap *pgVar2;
  byte *pbVar3;
  char in_SIL;
  gap *in_RDI;
  char_t *str_2;
  char_t *str_1;
  char_t ss;
  char_t *str;
  gap g;
  byte *local_48;
  char_t *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  byte bVar4;
  gap *in_stack_ffffffffffffffd0;
  char_t *in_stack_ffffffffffffffd8;
  gap *local_10;
  
  gap::gap((gap *)&stack0xffffffffffffffd8);
  pgVar2 = in_RDI;
  if (((anonymous_namespace)::chartype_table[*(byte *)&in_RDI->end] & 8) != 0) {
    do {
      in_stack_ffffffffffffffd0 = (gap *)((long)&pgVar2->end + 1);
      pgVar2 = in_stack_ffffffffffffffd0;
    } while (((anonymous_namespace)::chartype_table[*(byte *)&in_stack_ffffffffffffffd0->end] & 8)
             != 0);
    gap::push(in_stack_ffffffffffffffd0,
              (char_t **)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
              (size_t)in_stack_ffffffffffffffc0);
    pgVar2 = in_RDI;
  }
  do {
    while (local_10 = pgVar2, bVar4 = *(byte *)&local_10->end,
          ((anonymous_namespace)::chartype_table[bVar4] & 0xc) != 0) {
LAB_0015975a:
      if (*(char *)&local_10->end == in_SIL) {
        pbVar1 = (byte *)gap::flush((gap *)CONCAT17(bVar4,in_stack_ffffffffffffffc8),
                                    in_stack_ffffffffffffffc0);
        do {
          pbVar3 = pbVar1 + -1;
          *pbVar1 = 0;
          pbVar1 = pbVar3;
        } while (((anonymous_namespace)::chartype_table[*pbVar3] & 8) != 0);
        return (char_t *)((long)&local_10->end + 1);
      }
      if (((anonymous_namespace)::chartype_table[*(byte *)&local_10->end] & 8) == 0) {
        if (*(char *)&local_10->end == '&') {
          pgVar2 = (gap *)strconv_escape(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
        }
        else {
          if (*(char *)&local_10->end == '\0') {
            return (char_t *)0x0;
          }
          pgVar2 = (gap *)((long)&local_10->end + 1);
        }
      }
      else {
        pgVar2 = (gap *)((long)&local_10->end + 1);
        *(undefined1 *)&local_10->end = 0x20;
        if (((anonymous_namespace)::chartype_table[*(byte *)&pgVar2->end] & 8) != 0) {
          local_48 = (byte *)((long)&local_10->end + 2);
          while (((anonymous_namespace)::chartype_table[*local_48] & 8) != 0) {
            local_48 = local_48 + 1;
          }
          gap::push(in_stack_ffffffffffffffd0,(char_t **)CONCAT17(bVar4,in_stack_ffffffffffffffc8),
                    (size_t)in_stack_ffffffffffffffc0);
        }
      }
    }
    bVar4 = *(byte *)((long)&local_10->end + 1);
    if (((anonymous_namespace)::chartype_table[bVar4] & 0xc) != 0) {
      local_10 = (gap *)((long)&local_10->end + 1);
      goto LAB_0015975a;
    }
    bVar4 = *(byte *)((long)&local_10->end + 2);
    if (((anonymous_namespace)::chartype_table[bVar4] & 0xc) != 0) {
      local_10 = (gap *)((long)&local_10->end + 2);
      goto LAB_0015975a;
    }
    bVar4 = *(byte *)((long)&local_10->end + 3);
    if (((anonymous_namespace)::chartype_table[bVar4] & 0xc) != 0) {
      local_10 = (gap *)((long)&local_10->end + 3);
      goto LAB_0015975a;
    }
    pgVar2 = (gap *)((long)&local_10->end + 4);
  } while( true );
}

Assistant:

static char_t* parse_wnorm(char_t* s, char_t end_quote)
		{
			gap g;

			// trim leading whitespaces
			if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
			{
				char_t* str = s;

				do ++str;
				while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

				g.push(s, str - s);
			}

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws | ct_space));

				if (*s == end_quote)
				{
					char_t* str = g.flush(s);

					do *str-- = 0;
					while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					*s++ = ' ';

					if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
					{
						char_t* str = s + 1;
						while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space)) ++str;

						g.push(s, str - s);
					}
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}